

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O3

secp256k1_context * secp256k1_context_create(uint flags)

{
  void *prealloc;
  secp256k1_context *psVar1;
  void *in_RSI;
  undefined4 in_register_0000003c;
  void *__src;
  
  __src = (void *)CONCAT44(in_register_0000003c,flags);
  if ((char)flags == '\x01') {
    __src = (void *)0xd0;
    prealloc = malloc(0xd0);
    if (prealloc != (void *)0x0) {
      psVar1 = secp256k1_context_preallocated_create(prealloc,flags);
      return psVar1;
    }
  }
  else {
    secp256k1_context_create_cold_1();
  }
  secp256k1_context_create_cold_2();
  if (in_RSI != (void *)0x0) {
    psVar1 = (secp256k1_context *)memcpy(in_RSI,__src,0xd0);
    return psVar1;
  }
  secp256k1_context_preallocated_clone_cold_1();
  return (secp256k1_context *)0x0;
}

Assistant:

secp256k1_context* secp256k1_context_create(unsigned int flags) {
    size_t const prealloc_size = secp256k1_context_preallocated_size(flags);
    secp256k1_context* ctx = (secp256k1_context*)checked_malloc(&default_error_callback, prealloc_size);
    if (EXPECT(secp256k1_context_preallocated_create(ctx, flags) == NULL, 0)) {
        free(ctx);
        return NULL;
    }

    return ctx;
}